

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

Board * __thiscall Board::getHash_abi_cxx11_(Board *this)

{
  long in_RSI;
  __cxx11 local_68 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48 [36];
  int local_24;
  int local_20;
  int j;
  int i;
  Board *this_local;
  string *hash;
  
  j._3_1_ = 0;
  this_local = this;
  std::__cxx11::string::string((string *)this);
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
      std::__cxx11::to_string
                (local_68,*(int *)(in_RSI + (long)local_20 * 0x18 + (long)local_24 * 4));
      std::operator+(local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this);
      std::__cxx11::string::operator=((string *)this,(string *)local_48);
      std::__cxx11::string::~string((string *)local_48);
      std::__cxx11::string::~string((string *)local_68);
    }
  }
  return this;
}

Assistant:

std::string Board::getHash() {
    string hash = string();
    for (int i = 0; i < BOARD_SIZE; ++i) {
        for (int j = 0; j < BOARD_SIZE; ++j) {
            hash = hash + std::to_string(this->cells[i][j]);
        }
    }

    return hash;
}